

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseRAPass::initGlobalLiveSpans(BaseRAPass *this)

{
  byte bVar1;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *__s;
  long lVar2;
  size_t size;
  size_t sStack_38;
  
  lVar2 = 0;
  do {
    bVar1 = (((RARegCount *)(&this->_scratchRegIndexes + -4))->field_0)._regs[lVar2];
    if (bVar1 == 0) {
      __s = (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)0x0;
    }
    else {
      if (*(long *)&this->_allocator == 0) {
        initGlobalLiveSpans();
        return 1;
      }
      size = (ulong)bVar1 << 4;
      __s = (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)
            ZoneAllocator::_alloc(&this->_allocator,size,&sStack_38);
      if (__s == (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)0x0) {
        return 1;
      }
      memset(__s,0,size);
    }
    (this->_globalLiveSpans)._data[lVar2] = __s;
    lVar2 = lVar2 + 1;
    if (lVar2 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error BaseRAPass::initGlobalLiveSpans() noexcept {
  for (RegGroup group : RegGroupVirtValues{}) {
    size_t physCount = _physRegCount[group];
    LiveRegSpans* liveSpans = nullptr;

    if (physCount) {
      liveSpans = allocator()->allocT<LiveRegSpans>(physCount * sizeof(LiveRegSpans));
      if (ASMJIT_UNLIKELY(!liveSpans))
        return DebugUtils::errored(kErrorOutOfMemory);

      for (size_t physId = 0; physId < physCount; physId++)
        new(Support::PlacementNew{&liveSpans[physId]}) LiveRegSpans();
    }

    _globalLiveSpans[group] = liveSpans;
  }

  return kErrorOk;
}